

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall
SimpleStringInternalCache::printDeallocatingUnknownMemory
          (SimpleStringInternalCache *this,char *memory)

{
  UtestShell *pUVar1;
  char *pcVar2;
  SimpleString SStack_28;
  
  if (this->hasWarnedAboutDeallocations == false) {
    this->hasWarnedAboutDeallocations = true;
    pUVar1 = UtestShell::getCurrent();
    StringFromFormat((char *)&SStack_28,
                     "\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\nThis is likely due statics and will cause problems.\nOnly warning once to avoid recursive warnings.\nString we are deallocating: \"%s\"\n"
                     ,memory);
    pcVar2 = SimpleString::asCharString(&SStack_28);
    (*pUVar1->_vptr_UtestShell[0x1c])
              (pUVar1,pcVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
               ,0x9e);
    SimpleString::~SimpleString(&SStack_28);
  }
  return;
}

Assistant:

void SimpleStringInternalCache::printDeallocatingUnknownMemory(char* memory)
{
    if (!hasWarnedAboutDeallocations) {
        hasWarnedAboutDeallocations = true;
        UtestShell::getCurrent()->print(StringFromFormat("\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\n"
                                                         "This is likely due statics and will cause problems.\n"
                                                          "Only warning once to avoid recursive warnings.\n"
                                                          "String we are deallocating: \"%s\"\n", memory).asCharString(), __FILE__, __LINE__);
    }
}